

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableSymbols.cpp
# Opt level: O0

void slang::ast::VariableSymbol::fromSyntax
               (Compilation *compilation,DataDeclarationSyntax *syntax,Scope *scope,
               bool isCheckerFreeVar,SmallVectorBase<slang::ast::VariableSymbol_*> *results)

{
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_00;
  SourceRange sourceRange;
  SourceRange sourceRange_00;
  SourceRange sourceRange_01;
  bool bVar1;
  iterator iVar2;
  reference pTVar3;
  Symbol *pSVar4;
  InstanceBodySymbol *this;
  DefinitionSymbol *pDVar5;
  VariableLifetime *pVVar6;
  byte in_CL;
  ValueSymbol *in_RDX;
  long in_RSI;
  Token *in_RDI;
  VariableSymbol *variable;
  DeclaratorSyntax *declarator;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *__range2_1;
  bool isInIface;
  bool hasExplicitLifetime;
  Token mod;
  iterator __end2;
  iterator __begin2;
  TokenList *__range2;
  optional<slang::ast::VariableLifetime> lifetime;
  bool inProceduralContext;
  bool isConst;
  ValueSymbol *in_stack_fffffffffffffe58;
  ValueSymbol *in_stack_fffffffffffffe60;
  DeclaredType *in_stack_fffffffffffffe68;
  Token *this_00;
  VariableSymbol *in_stack_fffffffffffffe78;
  VariableSymbol *in_stack_fffffffffffffe80;
  ValueSymbol *in_stack_fffffffffffffe88;
  undefined7 in_stack_fffffffffffffe90;
  undefined1 uVar7;
  ValueSymbol *in_stack_fffffffffffffe98;
  undefined6 in_stack_fffffffffffffea0;
  short in_stack_fffffffffffffea6;
  bitmask<slang::ast::DeclaredTypeFlags> local_12c;
  DeclaredType *local_128;
  bitmask<slang::ast::VariableFlags> local_11c;
  bitmask<slang::ast::VariableFlags> local_11a [9];
  SourceLocation local_108;
  string_view local_100;
  VariableSymbol *local_f0;
  DeclaratorSyntax *local_e8;
  const_iterator local_e0;
  const_iterator local_d0;
  long local_c0;
  byte local_b5;
  VariableLifetime local_b4;
  undefined8 local_b0;
  byte local_a5;
  undefined4 local_a4;
  undefined8 local_a0;
  SourceRange local_98;
  undefined4 local_84;
  undefined4 local_80;
  undefined8 local_7c;
  undefined4 local_74;
  undefined8 local_70;
  Scope *in_stack_ffffffffffffff98;
  SourceLocation in_stack_ffffffffffffffa0;
  SourceLocation in_stack_ffffffffffffffa8;
  __normal_iterator<slang::parsing::Token_*,_std::span<slang::parsing::Token,_18446744073709551615UL>_>
  local_48;
  long local_40;
  undefined8 local_34;
  byte local_2a;
  byte local_29;
  byte local_19;
  ValueSymbol *local_18;
  long local_10;
  Token *local_8;
  
  local_19 = in_CL & 1;
  local_29 = 0;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_2a = Scope::isProceduralContext((Scope *)in_stack_fffffffffffffe58);
  std::optional<slang::ast::VariableLifetime>::optional
            ((optional<slang::ast::VariableLifetime> *)0x70976d);
  local_40 = local_10 + 0x50;
  local_48._M_current =
       (Token *)std::span<slang::parsing::Token,_18446744073709551615UL>::begin
                          ((span<slang::parsing::Token,_18446744073709551615UL> *)
                           in_stack_fffffffffffffe58);
  iVar2 = std::span<slang::parsing::Token,_18446744073709551615UL>::end
                    ((span<slang::parsing::Token,_18446744073709551615UL> *)
                     in_stack_fffffffffffffe68);
  while (bVar1 = __gnu_cxx::
                 operator==<slang::parsing::Token_*,_std::span<slang::parsing::Token,_18446744073709551615UL>_>
                           ((__normal_iterator<slang::parsing::Token_*,_std::span<slang::parsing::Token,_18446744073709551615UL>_>
                             *)in_stack_fffffffffffffe60,
                            (__normal_iterator<slang::parsing::Token_*,_std::span<slang::parsing::Token,_18446744073709551615UL>_>
                             *)in_stack_fffffffffffffe58), ((bVar1 ^ 0xffU) & 1) != 0) {
    pTVar3 = __gnu_cxx::
             __normal_iterator<slang::parsing::Token_*,_std::span<slang::parsing::Token,_18446744073709551615UL>_>
             ::operator*(&local_48);
    in_stack_ffffffffffffff98 = *(Scope **)pTVar3;
    in_stack_ffffffffffffffa0 = (SourceLocation)pTVar3->info;
    in_stack_fffffffffffffea6 = (short)in_stack_ffffffffffffff98;
    if (in_stack_fffffffffffffea6 == 0x67) {
      local_80 = 0;
      std::optional<slang::ast::VariableLifetime>::optional<slang::ast::VariableLifetime,_true>
                ((optional<slang::ast::VariableLifetime> *)in_stack_fffffffffffffe60,
                 (VariableLifetime *)in_stack_fffffffffffffe58);
      local_34 = local_7c;
      if ((local_2a & 1) == 0) {
        local_84 = 0x50006;
        in_stack_fffffffffffffe98 = local_18;
        local_98 = parsing::Token::range((Token *)in_stack_fffffffffffffe80);
        sourceRange.endLoc = in_stack_ffffffffffffffa8;
        sourceRange.startLoc = in_stack_ffffffffffffffa0;
        Scope::addDiag(in_stack_ffffffffffffff98,SUB84((ulong)iVar2._M_current >> 0x20,0),
                       sourceRange);
        local_a4 = 1;
        std::optional<slang::ast::VariableLifetime>::optional<slang::ast::VariableLifetime,_true>
                  ((optional<slang::ast::VariableLifetime> *)in_stack_fffffffffffffe60,
                   (VariableLifetime *)in_stack_fffffffffffffe58);
        local_34 = local_a0;
      }
    }
    else if (in_stack_fffffffffffffea6 == 0x7d) {
      local_29 = 1;
    }
    else if (in_stack_fffffffffffffea6 == 0x11c) {
      local_74 = 1;
      std::optional<slang::ast::VariableLifetime>::optional<slang::ast::VariableLifetime,_true>
                ((optional<slang::ast::VariableLifetime> *)in_stack_fffffffffffffe60,
                 (VariableLifetime *)in_stack_fffffffffffffe58);
      local_34 = local_70;
    }
    __gnu_cxx::
    __normal_iterator<slang::parsing::Token_*,_std::span<slang::parsing::Token,_18446744073709551615UL>_>
    ::operator++(&local_48);
  }
  local_a5 = std::optional<slang::ast::VariableLifetime>::has_value
                       ((optional<slang::ast::VariableLifetime> *)0x70994e);
  if (!(bool)local_a5) {
    local_b4 = getDefaultLifetime((Scope *)in_stack_fffffffffffffe68);
    std::optional<slang::ast::VariableLifetime>::optional<slang::ast::VariableLifetime,_true>
              ((optional<slang::ast::VariableLifetime> *)in_stack_fffffffffffffe60,
               (VariableLifetime *)in_stack_fffffffffffffe58);
    local_34 = local_b0;
  }
  pSVar4 = Scope::asSymbol((Scope *)local_18);
  uVar7 = false;
  if (pSVar4->kind == InstanceBody) {
    Scope::asSymbol((Scope *)local_18);
    this = Symbol::as<slang::ast::InstanceBodySymbol>((Symbol *)0x7099ca);
    pDVar5 = InstanceBodySymbol::getDefinition(this);
    uVar7 = pDVar5->definitionKind == Interface;
  }
  local_c0 = local_10 + 0x90;
  local_b5 = uVar7;
  local_d0 = slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::begin
                       ((SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *)0x709a0d);
  local_e0 = slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::end
                       ((SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *)0x709a2a);
  while (bVar1 = operator==<slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::iterator_base<const_slang::syntax::DeclaratorSyntax_*>_>
                           ((self_type *)in_stack_fffffffffffffe60,
                            (iterator_base<const_slang::syntax::DeclaratorSyntax_*> *)
                            in_stack_fffffffffffffe58), ((bVar1 ^ 0xffU) & 1) != 0) {
    local_e8 = iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::iterator_base<const_slang::syntax::DeclaratorSyntax_*>,_false>
               ::operator*((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::iterator_base<const_slang::syntax::DeclaratorSyntax_*>,_false>
                            *)0x709a67);
    this_00 = local_8;
    local_100 = parsing::Token::valueText(local_8);
    local_108 = parsing::Token::location(&local_e8->name);
    std::optional<slang::ast::VariableLifetime>::operator*
              ((optional<slang::ast::VariableLifetime> *)0x709ac3);
    in_stack_fffffffffffffe78 =
         BumpAllocator::
         emplace<slang::ast::VariableSymbol,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation,slang::ast::VariableLifetime&>
                   ((BumpAllocator *)CONCAT17(uVar7,in_stack_fffffffffffffe90),
                    (basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffe88,
                    (SourceLocation *)in_stack_fffffffffffffe80,
                    (VariableLifetime *)in_stack_fffffffffffffe78);
    local_f0 = in_stack_fffffffffffffe78;
    not_null<slang::syntax::DataTypeSyntax_*>::operator*
              ((not_null<slang::syntax::DataTypeSyntax_*> *)0x709b09);
    ValueSymbol::setDeclaredType
              (in_stack_fffffffffffffe60,(DataTypeSyntax *)in_stack_fffffffffffffe58);
    ValueSymbol::setFromDeclarator
              (in_stack_fffffffffffffe60,(DeclaratorSyntax *)in_stack_fffffffffffffe58);
    in_stack_fffffffffffffe80 = local_f0;
    in_stack_fffffffffffffe88 = local_18;
    std::span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>::
    span<const_slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>_&>
              ((span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> *)
               this_00,(SyntaxList<slang::syntax::AttributeInstanceSyntax> *)
                       in_stack_fffffffffffffe68);
    syntax_00._M_extent._M_extent_value._0_6_ = in_stack_fffffffffffffea0;
    syntax_00._M_ptr = (pointer)in_stack_fffffffffffffe98;
    syntax_00._M_extent._M_extent_value._6_2_ = in_stack_fffffffffffffea6;
    Symbol::setAttributes
              ((Symbol *)CONCAT17(uVar7,in_stack_fffffffffffffe90),
               (Scope *)in_stack_fffffffffffffe88,syntax_00);
    SmallVectorBase<slang::ast::VariableSymbol_*>::push_back
              ((SmallVectorBase<slang::ast::VariableSymbol_*> *)in_stack_fffffffffffffe60,
               (VariableSymbol **)in_stack_fffffffffffffe58);
    if ((local_29 & 1) != 0) {
      bitmask<slang::ast::VariableFlags>::bitmask(local_11a,Const);
      bitmask<slang::ast::VariableFlags>::operator|=(&local_f0->flags,local_11a);
    }
    if ((local_19 & 1) != 0) {
      bitmask<slang::ast::VariableFlags>::bitmask(&local_11c,CheckerFreeVariable);
      bitmask<slang::ast::VariableFlags>::operator|=(&local_f0->flags,&local_11c);
    }
    if ((local_b5 & 1) != 0) {
      local_128 = (DeclaredType *)ValueSymbol::getDeclaredType(in_stack_fffffffffffffe58);
      in_stack_fffffffffffffe68 =
           not_null<slang::ast::DeclaredType_*>::operator->
                     ((not_null<slang::ast::DeclaredType_*> *)0x709c2e);
      bitmask<slang::ast::DeclaredTypeFlags>::bitmask(&local_12c,InterfaceVariable);
      DeclaredType::addFlags
                ((DeclaredType *)in_stack_fffffffffffffe58,
                 (bitmask<slang::ast::DeclaredTypeFlags>)
                 (underlying_type)((ulong)in_stack_fffffffffffffe60 >> 0x20));
    }
    pVVar6 = std::optional<slang::ast::VariableLifetime>::operator*
                       ((optional<slang::ast::VariableLifetime> *)0x709c5d);
    if ((((*pVVar6 == Static) && ((local_a5 & 1) == 0)) &&
        (local_e8->initializer != (EqualsValueClauseSyntax *)0x0)) &&
       (bVar1 = Scope::isProceduralContext((Scope *)in_stack_fffffffffffffe58), bVar1)) {
      in_stack_fffffffffffffe60 = local_18;
      parsing::Token::range((Token *)in_stack_fffffffffffffe80);
      sourceRange_00.endLoc = in_stack_ffffffffffffffa8;
      sourceRange_00.startLoc = in_stack_ffffffffffffffa0;
      Scope::addDiag(in_stack_ffffffffffffff98,SUB84((ulong)iVar2._M_current >> 0x20,0),
                     sourceRange_00);
    }
    if ((((local_29 & 1) != 0) && (local_e8->initializer == (EqualsValueClauseSyntax *)0x0)) &&
       ((local_19 & 1) == 0)) {
      in_stack_fffffffffffffe58 = local_18;
      parsing::Token::range((Token *)in_stack_fffffffffffffe80);
      sourceRange_01.endLoc = in_stack_ffffffffffffffa8;
      sourceRange_01.startLoc = in_stack_ffffffffffffffa0;
      Scope::addDiag(in_stack_ffffffffffffff98,SUB84((ulong)iVar2._M_current >> 0x20,0),
                     sourceRange_01);
    }
    iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::iterator_base<const_slang::syntax::DeclaratorSyntax_*>,_false>
    ::
    operator++<slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::iterator_base<const_slang::syntax::DeclaratorSyntax_*>_>
              ((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::iterator_base<const_slang::syntax::DeclaratorSyntax_*>,_false>
                *)in_stack_fffffffffffffe60);
  }
  return;
}

Assistant:

void VariableSymbol::fromSyntax(Compilation& compilation, const DataDeclarationSyntax& syntax,
                                const Scope& scope, bool isCheckerFreeVar,
                                SmallVectorBase<VariableSymbol*>& results) {
    bool isConst = false;
    bool inProceduralContext = scope.isProceduralContext();
    std::optional<VariableLifetime> lifetime;
    for (Token mod : syntax.modifiers) {
        switch (mod.kind) {
            case TokenKind::VarKeyword:
                break;
            case TokenKind::ConstKeyword:
                isConst = true;
                break;
            case TokenKind::StaticKeyword:
                // Static lifetimes are allowed in all contexts.
                lifetime = VariableLifetime::Static;
                break;
            case TokenKind::AutomaticKeyword:
                // Automatic lifetimes are only allowed in procedural contexts.
                lifetime = VariableLifetime::Automatic;
                if (!inProceduralContext) {
                    scope.addDiag(diag::AutomaticNotAllowed, mod.range());
                    lifetime = VariableLifetime::Static;
                }
                break;
            default:
                SLANG_UNREACHABLE;
        }
    }

    // If no explicit lifetime is provided, find the default one for this scope.
    bool hasExplicitLifetime = lifetime.has_value();
    if (!hasExplicitLifetime)
        lifetime = getDefaultLifetime(scope);

    const bool isInIface =
        scope.asSymbol().kind == SymbolKind::InstanceBody &&
        scope.asSymbol().as<InstanceBodySymbol>().getDefinition().definitionKind ==
            DefinitionKind::Interface;

    for (auto declarator : syntax.declarators) {
        auto variable = compilation.emplace<VariableSymbol>(declarator->name.valueText(),
                                                            declarator->name.location(), *lifetime);
        variable->setDeclaredType(*syntax.type);
        variable->setFromDeclarator(*declarator);
        variable->setAttributes(scope, syntax.attributes);
        results.push_back(variable);

        if (isConst)
            variable->flags |= VariableFlags::Const;

        if (isCheckerFreeVar)
            variable->flags |= VariableFlags::CheckerFreeVariable;

        if (isInIface)
            variable->getDeclaredType()->addFlags(DeclaredTypeFlags::InterfaceVariable);

        // If this is a static variable in a procedural context and it has an initializer,
        // the spec requires that the static keyword must be explicitly provided.
        if (*lifetime == VariableLifetime::Static && !hasExplicitLifetime &&
            declarator->initializer && scope.isProceduralContext()) {
            scope.addDiag(diag::StaticInitializerMustBeExplicit, declarator->name.range());
        }

        // Constants require an initializer.
        if (isConst && !declarator->initializer && !isCheckerFreeVar)
            scope.addDiag(diag::ConstVarNoInitializer, declarator->name.range());
    }
}